

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O2

void __thiscall
RenX_LoggingPlugin::RenX_OnDonate
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *donor,PlayerInfo *player,
          double amount)

{
  undefined8 uVar1;
  undefined8 uVar2;
  code *pcVar3;
  string msg;
  undefined8 local_68;
  long local_60;
  string local_48;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x35 & 1) == 0) {
    pcVar3 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar3 = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)&local_68,&this->donateFmt);
  if (local_60 != 0) {
    RenX::processTags((string *)&local_68,server,donor,player,(BuildingInfo *)0x0);
    uVar1 = *(undefined8 *)(RenX::tags + 0x14e8);
    uVar2 = *(undefined8 *)(RenX::tags + 0x14f0);
    string_printf_abi_cxx11_(&local_48,"%.0f",amount);
    RenX::replace_tag(&local_68,uVar2,uVar1,local_48._M_string_length,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    (*pcVar3)(server,local_60,local_68);
  }
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnDonate(RenX::Server &server, const RenX::PlayerInfo &donor, const RenX::PlayerInfo &player, double amount)
{
	logFuncType func;
	if (RenX_LoggingPlugin::donatePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->donateFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &donor, &player);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_OBJECT_TAG, string_printf("%.0f", amount));
		(server.*func)(msg);
	}
}